

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QStringView needle,CaseSensitivity cs
                    )

{
  byte bVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char32_t cVar4;
  int iVar5;
  long lVar6;
  QChar *pQVar7;
  QChar *pQVar8;
  QChar *pQVar9;
  char16_t cVar10;
  ulong uVar11;
  short sVar12;
  char16_t cVar13;
  QChar *start;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  QChar *pQVar19;
  
  start = (QChar *)needle.m_data;
  lVar18 = needle.m_size;
  pQVar8 = (QChar *)haystack.m_data;
  uVar11 = haystack.m_size;
  if (lVar18 == 1) {
    if (uVar11 != 0) {
      cVar13 = start->ucs;
      if (from < 0) {
        lVar18 = uVar11 + from;
        if ((long)(uVar11 + from) < 0) {
          return -1;
        }
      }
      else {
        lVar18 = uVar11 - 1;
        if ((ulong)from <= uVar11) {
          lVar18 = from;
        }
      }
      if (cs == CaseSensitive) {
        if (-1 < lVar18) {
          do {
            if (cVar13 == (ushort)*(byte *)((long)&pQVar8->ucs + lVar18)) {
              return lVar18;
            }
            lVar6 = lVar18 + -1;
            lVar18 = lVar18 + -1;
          } while (pQVar8 <= (QChar *)((long)pQVar8 + lVar6));
        }
      }
      else {
        sVar12 = (short)((uint)(int)(short)*(ushort *)
                                            (QUnicodeTables::uc_properties +
                                            (ulong)*(ushort *)
                                                    (QUnicodeTables::uc_property_trie +
                                                    (ulong)(((ushort)cVar13 & 0x1f) +
                                                           (uint)*(ushort *)
                                                                  (QUnicodeTables::uc_property_trie
                                                                  + (ulong)((ushort)cVar13 >> 5) * 2
                                                                  )) * 2) * 0x14 + 0xe) >> 1);
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)(((ushort)cVar13 & 0x1f) +
                             (uint)*(ushort *)
                                    (QUnicodeTables::uc_property_trie +
                                    (ulong)((ushort)cVar13 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0)
        {
          cVar13 = sVar12 + cVar13;
        }
        else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2) == 1) {
          cVar13 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2 + 2);
        }
        if (-1 < lVar18) {
          do {
            bVar1 = *(byte *)((long)&pQVar8->ucs + lVar18);
            cVar10 = (char16_t)bVar1;
            sVar12 = (short)((uint)(int)(short)*(ushort *)
                                                (QUnicodeTables::uc_properties +
                                                (ulong)*(ushort *)
                                                        (QUnicodeTables::uc_property_trie +
                                                        (ulong)((bVar1 & 0x1f) +
                                                               (uint)*(ushort *)
                                                                      (QUnicodeTables::
                                                                       uc_property_trie +
                                                                      (ulong)(bVar1 >> 5) * 2)) * 2)
                                                * 0x14 + 0xe) >> 1);
            if ((*(ushort *)
                  (QUnicodeTables::uc_properties +
                  (ulong)*(ushort *)
                          (QUnicodeTables::uc_property_trie +
                          (ulong)((bVar1 & 0x1f) +
                                 (uint)*(ushort *)
                                        (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)
                                 ) * 2) * 0x14 + 0xe) & 1) == 0) {
              cVar10 = (ushort)bVar1 + sVar12;
            }
            else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2) == 1) {
              cVar10 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2 + 2);
            }
            if (cVar10 == cVar13) {
              return lVar18;
            }
            lVar6 = lVar18 + -1;
            lVar18 = lVar18 + -1;
          } while (pQVar8 <= (QChar *)((long)pQVar8 + lVar6));
        }
      }
    }
  }
  else {
    uVar16 = (from >> 0x3f & uVar11) + from;
    if (uVar16 == uVar11 && lVar18 == 0) {
      return uVar11;
    }
    uVar17 = uVar11 - lVar18;
    if (-1 < (long)uVar17 && uVar16 <= uVar11) {
      if ((long)uVar16 < (long)uVar17) {
        uVar17 = uVar16;
      }
      pQVar19 = (QChar *)((long)&pQVar8->ucs + uVar17);
      uVar11 = 0;
      if (lVar18 != 0) {
        uVar11 = lVar18 - 1;
      }
      if (cs == CaseSensitive) {
        if (lVar18 < 1) {
          lVar15 = 0;
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          lVar15 = 0;
          lVar14 = lVar18;
          do {
            lVar6 = (ulong)*(ushort *)
                            ((long)start + (lVar14 * 2 - (ulong)((uint)(lVar18 != 0) * 2))) +
                    lVar6 * 2;
            lVar15 = (ulong)*(byte *)((long)pQVar8 + lVar14 + (uVar17 - (lVar18 != 0))) + lVar15 * 2
            ;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        if (-1 < (long)uVar16) {
          lVar15 = lVar15 - (ulong)(byte)pQVar19->ucs;
          do {
            lVar15 = (ulong)(byte)pQVar19->ucs + lVar15;
            pQVar9 = pQVar19;
            pQVar7 = start;
            if (lVar15 == lVar6) {
              do {
                if (start + lVar18 <= pQVar7) {
                  return (long)pQVar19 - (long)pQVar8;
                }
                pcVar2 = &pQVar9->ucs;
                pcVar3 = &pQVar7->ucs;
                pQVar9 = (QChar *)((long)&pQVar9->ucs + 1);
                pQVar7 = pQVar7 + 1;
              } while (*pcVar3 == (ushort)(byte)*pcVar2);
            }
            pQVar19 = (QChar *)((long)&pQVar19[-1].ucs + 1);
            if (uVar11 < 0x40) {
              lVar15 = lVar15 - ((ulong)*(byte *)((long)&pQVar19->ucs + lVar18) <<
                                ((byte)uVar11 & 0x3f));
            }
            lVar15 = lVar15 * 2;
          } while (pQVar8 <= pQVar19);
        }
      }
      else {
        if (lVar18 < 1) {
          lVar15 = 0;
          lVar6 = 0;
          pQVar9 = pQVar8;
        }
        else {
          pQVar7 = start + uVar11;
          lVar6 = 0;
          lVar15 = 0;
          lVar14 = lVar18;
          do {
            pQVar9 = start;
            cVar4 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar7,start);
            lVar6 = (ulong)(uint)cVar4 + lVar6 * 2;
            cVar4 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(ulong)*(byte *)((long)pQVar8 +
                                                       lVar14 + (uVar17 - (lVar18 != 0))),
                               (char *)pQVar9);
            lVar15 = (ulong)(uint)cVar4 + lVar15 * 2;
            pQVar7 = pQVar7 + -1;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        if (-1 < (long)uVar16) {
          cVar4 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            ((char *)(ulong)(byte)pQVar19->ucs,(char *)pQVar9);
          lVar15 = lVar15 - (ulong)(uint)cVar4;
          do {
            cVar4 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(ulong)*(byte *)((long)&pQVar8->ucs + uVar17),(char *)pQVar9)
            ;
            lVar15 = (ulong)(uint)cVar4 + lVar15;
            if ((lVar15 == lVar6) &&
               (pQVar9 = start,
               iVar5 = ucstricmp(lVar18,(char16_t *)start,lVar18,
                                 (char *)((long)&pQVar8->ucs + uVar17)), iVar5 == 0)) {
              return uVar17;
            }
            if (uVar11 < 0x40) {
              cVar4 = (anonymous_namespace)::foldCaseHelper<char_const*>
                                ((char *)(ulong)*(byte *)((long)pQVar8 + uVar17 + lVar18 + -1),
                                 (char *)pQVar9);
              lVar15 = lVar15 - ((ulong)(uint)cVar4 << ((byte)uVar11 & 0x3f));
            }
            lVar15 = lVar15 * 2;
            lVar14 = uVar17 - 1;
            uVar17 = uVar17 - 1;
          } while (pQVar8 <= (QChar *)((long)pQVar8 + lVar14));
        }
      }
    }
  }
  return -1;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}